

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenu.cpp
# Opt level: O1

bool __thiscall DOptionMenu::MenuEvent(DOptionMenu *this,int mkey,bool fromcontroller)

{
  uint uVar1;
  uint uVar2;
  FOptionMenuItem *pFVar3;
  char cVar4;
  bool bVar5;
  undefined4 uVar6;
  int iVar7;
  undefined8 in_RAX;
  FOptionMenuDescriptor *pFVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  undefined8 uStack_38;
  
  uVar6 = (undefined4)in_RAX;
  if (6 < (uint)mkey) goto switchD_003132b4_caseD_2;
  pFVar8 = this->mDesc;
  uVar1 = pFVar8->mSelectedItem;
  uStack_38 = in_RAX;
  uStack_38._0_4_ = uVar6;
  switch((ulong)(uint)mkey) {
  case 0:
    if (uVar1 != 0xffffffff) {
      do {
        pFVar8 = this->mDesc;
        iVar10 = pFVar8->mSelectedItem;
        iVar7 = iVar10 + -1;
        pFVar8->mSelectedItem = iVar7;
        if ((0 < pFVar8->mScrollPos) && (iVar7 <= pFVar8->mScrollPos + pFVar8->mScrollTop)) {
          iVar7 = iVar7 + ~pFVar8->mScrollTop;
          if (iVar7 < 1) {
            iVar7 = 0;
          }
          pFVar8->mScrollPos = iVar7;
        }
        if (iVar10 < 1) {
          iVar7 = pFVar8->mPosition;
          if (iVar7 < 1) {
            if ((BigFont == (FFont *)0x0) || (*(int *)((pFVar8->mTitle).Chars + -0xc) == 0)) {
              iVar7 = -iVar7;
            }
            else {
              iVar7 = BigFont->FontHeight - iVar7;
            }
          }
          uVar2 = (pFVar8->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count;
          iVar7 = ~(((screen->super_DSimpleCanvas).super_DCanvas.Height -
                    (iVar7 + OptionSettings.mLinespacing) * CleanYfac_1) /
                   (OptionSettings.mLinespacing * CleanYfac_1)) + uVar2 + pFVar8->mScrollTop;
          if (iVar7 < 1) {
            iVar7 = 0;
          }
          pFVar8->mScrollPos = iVar7;
          pFVar8->mSelectedItem = uVar2 - 1;
        }
        iVar7 = (*((pFVar8->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array
                   [pFVar8->mSelectedItem]->super_FListMenuItem)._vptr_FListMenuItem[5])();
      } while (((char)iVar7 == '\0') && (this->mDesc->mSelectedItem != uVar1));
      goto LAB_0031358b;
    }
    break;
  case 1:
    if (uVar1 != 0xffffffff) {
      do {
        pFVar8 = this->mDesc;
        iVar7 = pFVar8->mSelectedItem + 1;
        pFVar8->mSelectedItem = iVar7;
        if ((this->CanScrollDown == true) && (iVar10 = this->VisBottom, iVar7 == iVar10)) {
          pFVar8->mScrollPos = pFVar8->mScrollPos + 1;
          this->VisBottom = iVar10 + 1;
        }
        if ((int)(pFVar8->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count <= iVar7)
        {
          if (uVar1 == 0xffffffff) {
            iVar7 = -1;
            pFVar8->mSelectedItem = -1;
            goto LAB_00313588;
          }
          pFVar8->mSelectedItem = 0;
          pFVar8->mScrollPos = 0;
        }
        iVar7 = (*((pFVar8->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array
                   [pFVar8->mSelectedItem]->super_FListMenuItem)._vptr_FListMenuItem[5])();
      } while (((char)iVar7 == '\0') && (this->mDesc->mSelectedItem != uVar1));
      goto LAB_0031358b;
    }
    break;
  default:
    goto switchD_003132b4_caseD_2;
  case 4:
    if (pFVar8->mScrollPos < 1) goto LAB_0031358b;
    iVar10 = (pFVar8->mScrollPos * 2 - this->VisBottom) + pFVar8->mScrollTop;
    iVar7 = 0;
    if (0 < iVar10) {
      iVar7 = iVar10;
    }
    pFVar8->mScrollPos = iVar7;
    if (uVar1 == 0xffffffff) goto LAB_0031358b;
    pFVar8->mSelectedItem = pFVar8->mScrollPos + pFVar8->mScrollTop + 1;
    iVar7 = (*((this->mDesc->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array
               [this->mDesc->mSelectedItem]->super_FListMenuItem)._vptr_FListMenuItem[5])();
    cVar4 = (char)iVar7;
    while (cVar4 == '\0') {
      pFVar8 = this->mDesc;
      iVar7 = pFVar8->mSelectedItem + 1;
      if ((int)(pFVar8->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count <= iVar7) {
        iVar7 = 0;
      }
      pFVar8->mSelectedItem = iVar7;
      iVar7 = (*((this->mDesc->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array
                 [this->mDesc->mSelectedItem]->super_FListMenuItem)._vptr_FListMenuItem[5])();
      cVar4 = (char)iVar7;
    }
    goto LAB_00313503;
  case 5:
    if (this->CanScrollDown != true) goto LAB_0031358b;
    uVar2 = (pFVar8->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count;
    iVar7 = pFVar8->mScrollTop;
    iVar10 = (this->VisBottom - pFVar8->mScrollPos) - iVar7;
    iVar11 = pFVar8->mScrollPos + iVar10;
    pFVar8->mScrollPos = iVar11;
    iVar10 = iVar10 + iVar7;
    if ((int)uVar2 < iVar11 + iVar10) {
      pFVar8->mScrollPos = uVar2 - iVar10;
    }
    if (uVar1 == 0xffffffff) goto LAB_0031358b;
    pFVar8->mSelectedItem = iVar7 + pFVar8->mScrollPos;
    iVar7 = (*((this->mDesc->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array
               [this->mDesc->mSelectedItem]->super_FListMenuItem)._vptr_FListMenuItem[5])();
    cVar4 = (char)iVar7;
    while (cVar4 == '\0') {
      pFVar8 = this->mDesc;
      iVar7 = pFVar8->mSelectedItem + 1;
      if ((int)(pFVar8->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count <= iVar7) {
        iVar7 = 0;
      }
      pFVar8->mSelectedItem = iVar7;
      iVar7 = (*((this->mDesc->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array
                 [this->mDesc->mSelectedItem]->super_FListMenuItem)._vptr_FListMenuItem[5])();
      cVar4 = (char)iVar7;
    }
LAB_00313503:
    pFVar8 = this->mDesc;
    iVar7 = pFVar8->mSelectedItem;
    if (iVar7 < pFVar8->mScrollPos) {
LAB_00313588:
      pFVar8->mScrollPos = iVar7;
    }
    goto LAB_0031358b;
  case 6:
    if ((-1 < (int)uVar1) &&
       (iVar7 = (*((pFVar8->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[uVar1]
                  ->super_FListMenuItem)._vptr_FListMenuItem[6])(), (char)iVar7 != '\0')) {
      return true;
    }
    goto switchD_003132b4_caseD_2;
  }
  iVar7 = FirstSelectable(this);
  this->mDesc->mSelectedItem = iVar7;
LAB_0031358b:
  if (this->mDesc->mSelectedItem != uVar1) {
    iVar7 = S_FindSound("menu/cursor");
    uStack_38 = CONCAT44(iVar7,(undefined4)uStack_38);
    S_Sound(0x22,(FSoundID *)((long)&uStack_38 + 4),snd_menuvolume.Value,0.0);
  }
  return true;
switchD_003132b4_caseD_2:
  lVar9 = (long)this->mDesc->mSelectedItem;
  if ((-1 < lVar9) &&
     (pFVar3 = (this->mDesc->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[lVar9]
     , iVar7 = (*(pFVar3->super_FListMenuItem)._vptr_FListMenuItem[0xd])
                         (pFVar3,(ulong)(uint)mkey,(ulong)fromcontroller), (char)iVar7 != '\0')) {
    return true;
  }
  bVar5 = DMenu::MenuEvent(&this->super_DMenu,mkey,fromcontroller);
  return bVar5;
}

Assistant:

bool DOptionMenu::MenuEvent (int mkey, bool fromcontroller)
{
	int startedAt = mDesc->mSelectedItem;

	switch (mkey)
	{
	case MKEY_Up:
		if (mDesc->mSelectedItem == -1)
		{
			mDesc->mSelectedItem = FirstSelectable();
			break;
		}
		do
		{
			--mDesc->mSelectedItem;

			if (mDesc->mScrollPos > 0 &&
				mDesc->mSelectedItem <= mDesc->mScrollTop + mDesc->mScrollPos)
			{
				mDesc->mScrollPos = MAX(mDesc->mSelectedItem - mDesc->mScrollTop - 1, 0);
			}

			if (mDesc->mSelectedItem < 0) 
			{
				// Figure out how many lines of text fit on the menu
				int y = mDesc->mPosition;

				if (y <= 0)
				{
					if (BigFont && mDesc->mTitle.IsNotEmpty())
					{
						y = -y + BigFont->GetHeight();
					}
					else
					{
						y = -y;
					}
				}
				y *= CleanYfac_1;
				int	rowheight = OptionSettings.mLinespacing * CleanYfac_1;
				int maxitems = (screen->GetHeight() - rowheight - y) / rowheight + 1;

				mDesc->mScrollPos = MAX (0, (int)mDesc->mItems.Size() - maxitems + mDesc->mScrollTop);
				mDesc->mSelectedItem = mDesc->mItems.Size()-1;
			}
		}
		while (!mDesc->mItems[mDesc->mSelectedItem]->Selectable() && mDesc->mSelectedItem != startedAt);
		break;

	case MKEY_Down:
		if (mDesc->mSelectedItem == -1)
		{
			mDesc->mSelectedItem = FirstSelectable();
			break;
		}
		do
		{
			++mDesc->mSelectedItem;
			
			if (CanScrollDown && mDesc->mSelectedItem == VisBottom)
			{
				mDesc->mScrollPos++;
				VisBottom++;
			}
			if (mDesc->mSelectedItem >= (int)mDesc->mItems.Size()) 
			{
				if (startedAt == -1)
				{
					mDesc->mSelectedItem = -1;
					mDesc->mScrollPos = -1;
					break;
				}
				else
				{
					mDesc->mSelectedItem = 0;
					mDesc->mScrollPos = 0;
				}
			}
		}
		while (!mDesc->mItems[mDesc->mSelectedItem]->Selectable() && mDesc->mSelectedItem != startedAt);
		break;

	case MKEY_PageUp:
		if (mDesc->mScrollPos > 0)
		{
			mDesc->mScrollPos -= VisBottom - mDesc->mScrollPos - mDesc->mScrollTop;
			if (mDesc->mScrollPos < 0)
			{
				mDesc->mScrollPos = 0;
			}
			if (mDesc->mSelectedItem != -1)
			{
				mDesc->mSelectedItem = mDesc->mScrollTop + mDesc->mScrollPos + 1;
				while (!mDesc->mItems[mDesc->mSelectedItem]->Selectable())
				{
					if (++mDesc->mSelectedItem >= (int)mDesc->mItems.Size())
					{
						mDesc->mSelectedItem = 0;
					}
				}
				if (mDesc->mScrollPos > mDesc->mSelectedItem)
				{
					mDesc->mScrollPos = mDesc->mSelectedItem;
				}
			}
		}
		break;

	case MKEY_PageDown:
		if (CanScrollDown)
		{
			int pagesize = VisBottom - mDesc->mScrollPos - mDesc->mScrollTop;
			mDesc->mScrollPos += pagesize;
			if (mDesc->mScrollPos + mDesc->mScrollTop + pagesize > (int)mDesc->mItems.Size())
			{
				mDesc->mScrollPos = mDesc->mItems.Size() - mDesc->mScrollTop - pagesize;
			}
			if (mDesc->mSelectedItem != -1)
			{
				mDesc->mSelectedItem = mDesc->mScrollTop + mDesc->mScrollPos;
				while (!mDesc->mItems[mDesc->mSelectedItem]->Selectable())
				{
					if (++mDesc->mSelectedItem >= (int)mDesc->mItems.Size())
					{
						mDesc->mSelectedItem = 0;
					}
				}
				if (mDesc->mScrollPos > mDesc->mSelectedItem)
				{
					mDesc->mScrollPos = mDesc->mSelectedItem;
				}
			}
		}
		break;

	case MKEY_Enter:
		if (mDesc->mSelectedItem >= 0 && mDesc->mItems[mDesc->mSelectedItem]->Activate()) 
		{
			return true;
		}
		// fall through to default
	default:
		if (mDesc->mSelectedItem >= 0 && 
			mDesc->mItems[mDesc->mSelectedItem]->MenuEvent(mkey, fromcontroller)) return true;
		return Super::MenuEvent(mkey, fromcontroller);
	}

	if (mDesc->mSelectedItem != startedAt)
	{
		S_Sound (CHAN_VOICE | CHAN_UI, "menu/cursor", snd_menuvolume, ATTN_NONE);
	}
	return true;
}